

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * multiSelectOrderByKeyInfo(Parse *pParse,Select *p,int nExtra)

{
  int *piVar1;
  Expr *pExpr;
  Vdbe *zC;
  Expr *pEVar2;
  long in_RSI;
  undefined8 *in_RDI;
  CollSeq *pColl;
  Expr *pTerm;
  ExprList_item *pItem;
  int i;
  KeyInfo *pRet;
  sqlite3 *db;
  int nOrderBy;
  ExprList *pOrderBy;
  int in_stack_ffffffffffffffa0;
  int N;
  int iCol;
  sqlite3 *in_stack_ffffffffffffffa8;
  sqlite3 *pParse_00;
  Parse *pParse_01;
  int local_3c;
  Parse *pParse_02;
  
  piVar1 = *(int **)(in_RSI + 0x48);
  if (piVar1 == (int *)0x0) {
    N = 0;
  }
  else {
    N = *piVar1;
  }
  pParse_02 = (Parse *)*in_RDI;
  iCol = N;
  pExpr = (Expr *)sqlite3KeyInfoAlloc(in_stack_ffffffffffffffa8,N,in_stack_ffffffffffffffa0);
  if (pExpr != (Expr *)0x0) {
    for (local_3c = 0; local_3c < N; local_3c = local_3c + 1) {
      pParse_01 = (Parse *)(piVar1 + (long)local_3c * 6 + 2);
      pParse_00 = pParse_01->db;
      if (((ulong)pParse_00->pVfs & 0x20000000000) == 0) {
        zC = (Vdbe *)multiSelectCollSeq((Parse *)pParse_00,(Select *)&DAT_aaaaaaaaaaaaaaaa,iCol);
        if (zC == (Vdbe *)0x0) {
          zC = pParse_02->pVdbe;
        }
        pEVar2 = sqlite3ExprAddCollateString(pParse_01,(Expr *)pParse_00,(char *)zC);
        *(Expr **)(piVar1 + (long)local_3c * 6 + 2) = pEVar2;
      }
      else {
        zC = (Vdbe *)sqlite3ExprCollSeq(pParse_02,pExpr);
      }
      (&pExpr->x)[local_3c].pList = (ExprList *)zC;
      (&pExpr->pRight->op)[local_3c] = (u8)piVar1[(long)local_3c * 6 + 6];
    }
  }
  return (KeyInfo *)pExpr;
}

Assistant:

static KeyInfo *multiSelectOrderByKeyInfo(Parse *pParse, Select *p, int nExtra){
  ExprList *pOrderBy = p->pOrderBy;
  int nOrderBy = ALWAYS(pOrderBy!=0) ? pOrderBy->nExpr : 0;
  sqlite3 *db = pParse->db;
  KeyInfo *pRet = sqlite3KeyInfoAlloc(db, nOrderBy+nExtra, 1);
  if( pRet ){
    int i;
    for(i=0; i<nOrderBy; i++){
      struct ExprList_item *pItem = &pOrderBy->a[i];
      Expr *pTerm = pItem->pExpr;
      CollSeq *pColl;

      if( pTerm->flags & EP_Collate ){
        pColl = sqlite3ExprCollSeq(pParse, pTerm);
      }else{
        pColl = multiSelectCollSeq(pParse, p, pItem->u.x.iOrderByCol-1);
        if( pColl==0 ) pColl = db->pDfltColl;
        pOrderBy->a[i].pExpr =
          sqlite3ExprAddCollateString(pParse, pTerm, pColl->zName);
      }
      assert( sqlite3KeyInfoIsWriteable(pRet) );
      pRet->aColl[i] = pColl;
      pRet->aSortFlags[i] = pOrderBy->a[i].fg.sortFlags;
    }
  }

  return pRet;
}